

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O0

void __thiscall
btPoint2PointConstraint::setParam(btPoint2PointConstraint *this,int num,btScalar value,int axis)

{
  int axis_local;
  btScalar value_local;
  int num_local;
  btPoint2PointConstraint *this_local;
  
  if (axis == -1) {
    if (num - 1U < 2) {
      this->m_erp = value;
      this->m_flags = this->m_flags | 1;
    }
    else if (num - 3U < 2) {
      this->m_cfm = value;
      this->m_flags = this->m_flags | 2;
    }
  }
  return;
}

Assistant:

void btPoint2PointConstraint::setParam(int num, btScalar value, int axis)
{
	if(axis != -1)
	{
		btAssertConstrParams(0);
	}
	else
	{
		switch(num)
		{
			case BT_CONSTRAINT_ERP :
			case BT_CONSTRAINT_STOP_ERP :
				m_erp = value; 
				m_flags |= BT_P2P_FLAGS_ERP;
				break;
			case BT_CONSTRAINT_CFM :
			case BT_CONSTRAINT_STOP_CFM :
				m_cfm = value; 
				m_flags |= BT_P2P_FLAGS_CFM;
				break;
			default: 
				btAssertConstrParams(0);
		}
	}
}